

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

nfa_state_t * __thiscall re2c::CloseOp::compile(CloseOp *this,nfa_t *nfa,nfa_state_t *t)

{
  uint uVar1;
  nfa_state_t *pnVar2;
  int iVar3;
  undefined4 extraout_var;
  
  pnVar2 = nfa->states;
  uVar1 = nfa->size;
  nfa->size = uVar1 + 1;
  iVar3 = (*this->exp->_vptr_RegExp[5])(this->exp,nfa,pnVar2 + uVar1);
  pnVar2[uVar1].type = ALT;
  pnVar2[uVar1].value.alt.out1 = t;
  pnVar2[uVar1].value.alt.out2 = (nfa_state_t *)CONCAT44(extraout_var,iVar3);
  pnVar2[uVar1].mark = false;
  return pnVar2 + uVar1;
}

Assistant:

nfa_state_t *CloseOp::compile(nfa_t &nfa, nfa_state_t *t)
{
	nfa_state_t *s = &nfa.states[nfa.size++];
	s->alt(t, exp->compile(nfa, s));
	return s;
}